

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O1

void do_note_off_extra(_note *nte)

{
  byte bVar1;
  int iVar2;
  
  nte->is_off = '\0';
  bVar1 = nte->modes;
  if ((bVar1 & 0x40) == 0) {
    if ((bVar1 & 4) != 0) {
      nte->modes = bVar1 & 0xbb;
    }
    nte->env_inc = 0;
    return;
  }
  if (nte->hold != 0) {
    nte->hold = nte->hold | 2;
    return;
  }
  if ((bVar1 & 0x20) == 0) {
    if ((char)bVar1 < '\0') {
      if (4 < nte->env) {
        return;
      }
      nte->env = '\x05';
      iVar2 = nte->sample->env_rate[5];
      if (nte->env_level <= nte->sample->env_target[5]) goto LAB_0034304c;
    }
    else {
      if (3 < nte->env) {
        return;
      }
      nte->env = '\x04';
      iVar2 = nte->sample->env_rate[4];
      if (nte->env_level <= nte->sample->env_target[4]) goto LAB_0034304c;
    }
  }
  else {
    if (2 < nte->env) {
      return;
    }
    nte->env = '\x03';
    iVar2 = nte->sample->env_rate[3];
    if (nte->env_level <= nte->sample->env_target[3]) goto LAB_0034304c;
  }
  iVar2 = -iVar2;
LAB_0034304c:
  nte->env_inc = iVar2;
  return;
}

Assistant:

static void do_note_off_extra(struct _note *nte) {

	nte->is_off = 0;


	if (!(nte->modes & SAMPLE_ENVELOPE)) {
		if (nte->modes & SAMPLE_LOOP) {
			nte->modes ^= SAMPLE_LOOP;
		}
		nte->env_inc = 0;

	} else if (nte->hold) {
		nte->hold |= HOLD_OFF;

	} else if (nte->modes & SAMPLE_SUSTAIN) {
		if (nte->env < 3) {
			nte->env = 3;
			if (nte->env_level > nte->sample->env_target[3]) {
				nte->env_inc = -nte->sample->env_rate[3];
			} else {
				nte->env_inc = nte->sample->env_rate[3];
			}
		}

	} else if (nte->modes & SAMPLE_CLAMPED) {
		if (nte->env < 5) {
			nte->env = 5;
			if (nte->env_level > nte->sample->env_target[5]) {
				nte->env_inc = -nte->sample->env_rate[5];
			} else {
				nte->env_inc = nte->sample->env_rate[5];
			}
		}
	} else if (nte->env < 4) {
		nte->env = 4;
		if (nte->env_level > nte->sample->env_target[4]) {
			nte->env_inc = -nte->sample->env_rate[4];
		} else {
			nte->env_inc = nte->sample->env_rate[4];
		}
	}
}